

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_read_fuzzer_common.h
# Opt level: O1

void fuzzer_read(zip_t *za,zip_error_t *error,char *password)

{
  FILE *pFVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  char *__format;
  ulong uVar7;
  char buf [32768];
  undefined1 auStack_8038 [32776];
  
  if (za == (zip_t *)0x0) {
    fuzzer_read_cold_2();
  }
  else {
    zip_set_default_password(za,password);
    zip_error_fini(error);
    uVar3 = zip_get_num_entries(za,0);
    if (0 < (long)uVar3) {
      uVar7 = 0;
      do {
        lVar4 = zip_fopen_index(za,uVar7,0);
        __format = "Error opening file %d: %s\n";
        if (lVar4 == 0) {
LAB_00101528:
          pFVar1 = _stderr;
          uVar6 = zip_strerror(za);
          fprintf(pFVar1,__format,uVar7 & 0xffffffff,uVar6);
        }
        else {
          do {
            lVar5 = zip_fread(lVar4,auStack_8038,0x8000);
            pFVar1 = _stderr;
          } while (0 < lVar5);
          if (lVar5 < 0) {
            uVar6 = zip_strerror(za);
            fprintf(pFVar1,"Error reading file %d: %s\n",uVar7 & 0xffffffff,uVar6);
          }
          iVar2 = zip_fclose(lVar4);
          __format = "Error closing file %d: %s\n";
          if (iVar2 < 0) goto LAB_00101528;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar3);
    }
    iVar2 = zip_close(za);
    if (iVar2 < 0) {
      fuzzer_read_cold_1();
    }
  }
  return;
}

Assistant:

void fuzzer_read(zip_t *za, zip_error_t *error, const char *password) {
    zip_int64_t i, n, ret;
    char buf[32768];

    if (za == NULL) {
        fprintf(stderr, "Error opening archive: %s\n", zip_error_strerror(error));
        zip_error_fini(error);
        return;
    }

    zip_set_default_password(za, password);

    zip_error_fini(error);

    n = zip_get_num_entries(za, 0);
    for (i = 0; i < n; i++) {
        zip_file_t *f = zip_fopen_index(za, i, 0);
        if (f == NULL) {
            fprintf(stderr, "Error opening file %d: %s\n", (int)i, zip_strerror(za));
            continue;
        }

        while ((ret = zip_fread(f, buf, sizeof(buf))) > 0) {
            ;
        }
        if (ret < 0) {
            fprintf(stderr, "Error reading file %d: %s\n", (int)i, zip_strerror(za));
        }
        if (zip_fclose(f) < 0) {
            fprintf(stderr, "Error closing file %d: %s\n", (int)i, zip_strerror(za));
            continue;
        }
    }
    if (zip_close(za) < 0) {
        fprintf(stderr, "Error closing archive: %s\n", zip_strerror(za));
        zip_discard(za);
    }
}